

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreBinarySerializer.cpp
# Opt level: O0

void __thiscall
Assimp::Ogre::OgreBinarySerializer::ReadSubMeshNames(OgreBinarySerializer *this,Mesh *mesh)

{
  bool bVar1;
  DeadlyImportError *this_00;
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> *pbVar2;
  basic_formatter *pbVar3;
  Logger *this_01;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_388;
  string local_210;
  string local_1f0;
  undefined1 local_1cd;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  string local_48;
  SubMesh *local_28;
  SubMesh *submesh;
  uint16_t submeshIndex;
  Mesh *pMStack_18;
  uint16_t id;
  Mesh *mesh_local;
  OgreBinarySerializer *this_local;
  
  submesh._6_2_ = 0;
  pMStack_18 = mesh;
  mesh_local = (Mesh *)this;
  bVar1 = AtEnd(this);
  if (!bVar1) {
    submesh._6_2_ = ReadHeader(this,true);
    while (bVar1 = AtEnd(this), !bVar1 && submesh._6_2_ == 0xa100) {
      submesh._4_2_ = Read<unsigned_short>(this);
      local_28 = Ogre::Mesh::GetSubMesh(pMStack_18,(ulong)submesh._4_2_);
      if (local_28 == (SubMesh *)0x0) {
        local_1cd = 1;
        this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
        basic_formatter(&local_1c0);
        pbVar2 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                 Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                 operator<<((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                            &local_1c0,(char (*) [36])"Ogre Mesh does not include submesh ");
        pbVar2 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                 Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                 operator<<(pbVar2,(unsigned_short *)((long)&submesh + 4));
        pbVar3 = (basic_formatter *)
                 Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                 operator<<(pbVar2,(char (*) [64])
                                   " referenced in M_SUBMESH_NAME_TABLE_ELEMENT. Invalid mesh file."
                           );
        Formatter::basic_formatter::operator_cast_to_string(&local_48,pbVar3);
        DeadlyImportError::DeadlyImportError(this_00,&local_48);
        local_1cd = 0;
        __cxa_throw(this_00,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
      }
      ReadLine_abi_cxx11_(&local_1f0,this);
      std::__cxx11::string::operator=
                ((string *)&(local_28->super_ISubMesh).name,(string *)&local_1f0);
      std::__cxx11::string::~string((string *)&local_1f0);
      this_01 = DefaultLogger::get();
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      basic_formatter<char[13]>(&local_388,(char (*) [13])"  - SubMesh ");
      pbVar2 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
               Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
               operator_((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                         &local_388,(uint *)local_28);
      pbVar2 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
               Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
               operator_(pbVar2,(char (*) [8])" name \'");
      pbVar2 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
               Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
               operator_(pbVar2,&(local_28->super_ISubMesh).name);
      pbVar3 = (basic_formatter *)
               Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
               operator_(pbVar2,(char (*) [2])0xb97894);
      Formatter::basic_formatter::operator_cast_to_string(&local_210,pbVar3);
      Logger::debug(this_01,&local_210);
      std::__cxx11::string::~string((string *)&local_210);
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      ~basic_formatter(&local_388);
      bVar1 = AtEnd(this);
      if (!bVar1) {
        submesh._6_2_ = ReadHeader(this,true);
      }
    }
    bVar1 = AtEnd(this);
    if (!bVar1) {
      RollbackHeader(this);
    }
  }
  return;
}

Assistant:

void OgreBinarySerializer::ReadSubMeshNames(Mesh *mesh)
{
    uint16_t id = 0;

    if (!AtEnd())
    {
        id = ReadHeader();
        while (!AtEnd() && id == M_SUBMESH_NAME_TABLE_ELEMENT)
        {
            uint16_t submeshIndex = Read<uint16_t>();
            SubMesh *submesh = mesh->GetSubMesh(submeshIndex);
            if (!submesh) {
                throw DeadlyImportError(Formatter::format() << "Ogre Mesh does not include submesh " << submeshIndex << " referenced in M_SUBMESH_NAME_TABLE_ELEMENT. Invalid mesh file.");
            }

            submesh->name = ReadLine();
            ASSIMP_LOG_DEBUG_F( "  - SubMesh ", submesh->index, " name '", submesh->name, "'");

            if (!AtEnd())
                id = ReadHeader();
        }
        if (!AtEnd())
            RollbackHeader();
    }
}